

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::SimpleQueriesTestCase::iterate(SimpleQueriesTestCase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  SimpleQueriesTestCase *this_00;
  TestContext *this_01;
  Functions *gl;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar1) {
    this_00 = (SimpleQueriesTestCase *)((this->super_TestCase).m_context)->m_renderCtx;
    iVar2 = (*(this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    testSipmleQueries(this_00,gl,0x9198);
    testSipmleQueries(this_00,gl,0x9199);
    testSipmleQueries(this_00,gl,0x919a);
    testSipmleQueries(this_00,gl,0x91a9);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SimpleQueriesTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	testSipmleQueries(gl, GL_MAX_SPARSE_TEXTURE_SIZE_ARB);
	testSipmleQueries(gl, GL_MAX_SPARSE_3D_TEXTURE_SIZE_ARB);
	testSipmleQueries(gl, GL_MAX_SPARSE_ARRAY_TEXTURE_LAYERS_ARB);
	testSipmleQueries(gl, GL_SPARSE_TEXTURE_FULL_ARRAY_CUBE_MIPMAPS_ARB);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}